

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

divider<unsigned_long,_(libdivide::Branching)0> generate_1_divisor<unsigned_long>(unsigned_long d)

{
  undefined1 auVar1 [16];
  dispatcher_t dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong in_RDI;
  uint64_t twice_rem;
  uint64_t e;
  uint8_t more;
  uint64_t rem;
  uint64_t proposed_m;
  uint32_t floor_log_2_d;
  libdivide_u64_t result;
  uint64_t result_1;
  undefined1 local_f9 [17];
  undefined1 *local_e8;
  undefined1 *local_c8;
  byte local_61;
  long local_58;
  undefined4 local_4c;
  uint64_t local_39;
  byte local_31;
  
  local_e8 = local_f9;
  local_4c = 0;
  if (in_RDI == 0) {
    local_c8 = local_e8;
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x44c,"libdivide_internal_u64_gen",
            "divider must be != 0");
    abort();
  }
  local_61 = 0x3f - (char)LZCOUNT(in_RDI);
  if ((in_RDI & in_RDI - 1) == 0) {
    local_39 = 0;
    local_31 = local_61;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = 1L << (local_61 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI;
    local_58 = 0;
    uVar4 = SUB168((auVar3 << 0x40) % auVar1,0);
    if ((ulong)(1L << (local_61 & 0x3f)) <= in_RDI - uVar4) {
      local_58 = 0;
      if ((in_RDI <= uVar4 * 2) || (uVar4 * 2 < uVar4)) {
        local_58 = 1;
      }
      local_61 = local_61 | 0x40;
    }
    local_39 = local_58 + 1;
    local_31 = local_61;
  }
  dVar2.denom.more = local_31;
  dVar2.denom.magic = local_39;
  return (dispatcher_t)(dispatcher_t)dVar2.denom;
}

Assistant:

NOINLINE divider<IntT> generate_1_divisor(IntT d) {
    return divider<IntT>(d);
}